

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  BtShared *pBt;
  int iVar1;
  Pgno PVar2;
  MemPage *pPage;
  Pgno pgno;
  u8 eType;
  int local_64;
  MemPage *pRoot;
  Pgno pgnoRoot;
  Pgno local_50;
  Pgno pgnoMove;
  MemPage *pPageMove;
  MemPage *local_40;
  Pgno *local_38;
  uint uVar3;
  
  sqlite3BtreeEnter(p);
  pBt = p->pBt;
  if (pBt->autoVacuum == '\0') {
    iVar1 = allocateBtreePage(pBt,&pRoot,&pgnoRoot,1,'\0');
    pPage = pRoot;
    local_64 = iVar1;
    if (iVar1 != 0) goto LAB_0013ba2f;
LAB_0013b933:
    zeroPage(pPage,(flags & 1U) * 3 + 10);
    sqlite3PagerUnref(pPage->pDbPage);
    *piTable = pgnoRoot;
    iVar1 = 0;
  }
  else {
    local_38 = piTable;
    invalidateAllOverflowCache(pBt);
    sqlite3BtreeGetMeta(p,4,&pgnoRoot);
    iVar1 = sqlite3PendingByte;
    if (pBt->nPage < pgnoRoot) {
      iVar1 = sqlite3CorruptError(0x12af0);
      goto LAB_0013ba2f;
    }
    do {
      do {
        uVar3 = pgnoRoot;
        pgno = uVar3 + 1;
        PVar2 = ptrmapPageno(pBt,pgno);
        pgnoRoot = pgno;
      } while (pgno == PVar2);
    } while (uVar3 == (uint)iVar1 / pBt->pageSize);
    iVar1 = allocateBtreePage(pBt,&pPageMove,&pgnoMove,pgno,'\x01');
    local_64 = iVar1;
    if (iVar1 != 0) goto LAB_0013ba2f;
    if (pgnoMove == pgno) {
      pRoot = pPageMove;
      pPage = pPageMove;
LAB_0013b9c4:
      ptrmapPut(pBt,pgno,'\x01',0,&local_64);
      iVar1 = local_64;
      if ((local_64 == 0) &&
         (iVar1 = sqlite3BtreeUpdateMeta(p,4,pgno), piTable = local_38, local_64 = iVar1, iVar1 == 0
         )) goto LAB_0013b933;
    }
    else {
      eType = '\0';
      local_50 = 0;
      iVar1 = saveAllCursors(pBt,0,(BtCursor *)0x0);
      releasePage(pPageMove);
      if ((iVar1 != 0) || (iVar1 = btreeGetPage(pBt,pgno,&pRoot,0), iVar1 != 0)) goto LAB_0013ba2f;
      iVar1 = ptrmapGet(pBt,pgno,&eType,&local_50);
      if ((byte)(eType - 1) < 2) {
        iVar1 = sqlite3CorruptError(0x12b20);
        pPage = pRoot;
      }
      else {
        pPage = pRoot;
        if (iVar1 == 0) {
          local_40 = pRoot;
          iVar1 = relocatePage(pBt,pRoot,eType,local_50,pgnoMove,0);
          releasePage(local_40);
          if ((iVar1 != 0) || (iVar1 = btreeGetPage(pBt,pgno,&pRoot,0), pPage = pRoot, iVar1 != 0))
          goto LAB_0013ba2f;
          iVar1 = sqlite3PagerWrite(pRoot->pDbPage);
          local_64 = iVar1;
          if (iVar1 != 0) {
            releasePageNotNull(pPage);
            goto LAB_0013ba2f;
          }
          goto LAB_0013b9c4;
        }
      }
    }
    releasePage(pPage);
  }
LAB_0013ba2f:
  sqlite3BtreeLeave(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}